

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::switchToFullscreen(WindowImplX11 *this)

{
  bool bVar1;
  int iVar2;
  Atom AVar3;
  ostream *poVar4;
  string *in_RDI;
  int result;
  XEvent event;
  Atom netWmStateFullscreen;
  Atom netWmState;
  Atom netWmBypassCompositor;
  allocator *paVar5;
  undefined1 onlyIfExists;
  undefined4 local_168 [8];
  size_type local_148;
  Atom local_140;
  undefined4 local_138;
  undefined8 local_130;
  Atom local_128;
  undefined8 local_120;
  undefined8 local_118;
  allocator local_a1;
  string local_a0 [32];
  Atom local_80;
  allocator local_71;
  string local_70 [32];
  Atom local_50;
  allocator local_31;
  string local_30 [32];
  WindowImplX11 *in_stack_fffffffffffffff0;
  
  grabFocus(in_stack_fffffffffffffff0);
  bVar1 = anon_unknown.dwarf_23372c::WindowsImplX11Impl::ewmhSupported();
  if (bVar1) {
    paVar5 = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"_NET_WM_BYPASS_COMPOSITOR",paVar5);
    onlyIfExists = (undefined1)((ulong)paVar5 >> 0x38);
    AVar3 = getAtom(in_RDI,(bool)onlyIfExists);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    if (AVar3 != 0) {
      XChangeProperty(in_RDI[0x1e].field_2._M_allocated_capacity,in_RDI[0x1e]._M_string_length,AVar3
                      ,6,0x20,0,&switchToFullscreen::bypassCompositor,1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"_NET_WM_STATE",&local_71);
    AVar3 = getAtom(in_RDI,(bool)onlyIfExists);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    local_50 = AVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"_NET_WM_STATE_FULLSCREEN",&local_a1);
    AVar3 = getAtom(in_RDI,(bool)onlyIfExists);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    local_80 = AVar3;
    if ((local_50 == 0) || (AVar3 == 0)) {
      poVar4 = err();
      poVar4 = std::operator<<(poVar4,"Setting fullscreen failed. Could not get required atoms");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      memset(local_168,0,0xc0);
      local_168[0] = 0x21;
      local_148 = in_RDI[0x1e]._M_string_length;
      local_138 = 0x20;
      local_140 = local_50;
      local_130 = 1;
      local_128 = local_80;
      local_120 = 0;
      local_118 = 1;
      iVar2 = XSendEvent(in_RDI[0x1e].field_2._M_allocated_capacity,
                         *(undefined8 *)
                          (*(long *)(in_RDI[0x1e].field_2._M_allocated_capacity + 0xe8) +
                           (long)*(int *)(in_RDI[0x1e].field_2._M_allocated_capacity + 0xe0) * 0x80
                          + 0x10),0,0x180000,local_168);
      if (iVar2 == 0) {
        poVar4 = err();
        poVar4 = std::operator<<(poVar4,
                                 "Setting fullscreen failed, could not send \"_NET_WM_STATE\" event"
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  return;
}

Assistant:

void WindowImplX11::switchToFullscreen()
{
    using namespace WindowsImplX11Impl;

    grabFocus();

    if (ewmhSupported())
    {
        Atom netWmBypassCompositor = getAtom("_NET_WM_BYPASS_COMPOSITOR");

        if (netWmBypassCompositor)
        {
            static const unsigned long bypassCompositor = 1;

            XChangeProperty(m_display,
                            m_window,
                            netWmBypassCompositor,
                            XA_CARDINAL,
                            32,
                            PropModeReplace,
                            reinterpret_cast<const unsigned char*>(&bypassCompositor),
                            1);
        }

        Atom netWmState = getAtom("_NET_WM_STATE", true);
        Atom netWmStateFullscreen = getAtom("_NET_WM_STATE_FULLSCREEN", true);

        if (!netWmState || !netWmStateFullscreen)
        {
            err() << "Setting fullscreen failed. Could not get required atoms" << std::endl;
            return;
        }

        XEvent event;
        std::memset(&event, 0, sizeof(event));

        event.type = ClientMessage;
        event.xclient.window = m_window;
        event.xclient.format = 32;
        event.xclient.message_type = netWmState;
        event.xclient.data.l[0] = 1; // _NET_WM_STATE_ADD
        event.xclient.data.l[1] = static_cast<long>(netWmStateFullscreen);
        event.xclient.data.l[2] = 0; // No second property
        event.xclient.data.l[3] = 1; // Normal window

        int result = XSendEvent(m_display,
                                DefaultRootWindow(m_display),
                                False,
                                SubstructureNotifyMask | SubstructureRedirectMask,
                                &event);

        if (!result)
            err() << "Setting fullscreen failed, could not send \"_NET_WM_STATE\" event" << std::endl;
    }
}